

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtable.cpp
# Opt level: O2

void __thiscall FStringTable::SetString(FStringTable *this,char *name,char *newString)

{
  size_t sVar1;
  size_t sVar2;
  StringEntry *pSVar3;
  StringEntry *oentry;
  StringEntry **pentry;
  StringEntry *local_40;
  StringEntry **local_38;
  
  FindString(this,name,&local_38,&local_40);
  sVar1 = strlen(newString);
  sVar2 = strlen(name);
  pSVar3 = (StringEntry *)
           M_Malloc_Dbg(sVar2 + sVar1 + 0x1a,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/stringtable.cpp"
                        ,0x19c);
  strcpy(&pSVar3->field_0x11,newString);
  pSVar3->Name = &pSVar3->field_0x12 + sVar1;
  strcpy(&pSVar3->field_0x12 + sVar1,name);
  pSVar3->PassNum = '\0';
  if (local_40 != (StringEntry *)0x0) {
    *local_38 = pSVar3;
    pSVar3->Next = local_40->Next;
    M_Free(local_40);
    return;
  }
  pSVar3->Next = *local_38;
  *local_38 = pSVar3;
  return;
}

Assistant:

void FStringTable::SetString (const char *name, const char *newString)
{
	StringEntry **pentry, *oentry;
	FindString (name, pentry, oentry);

	size_t newlen = strlen (newString);
	size_t namelen = strlen (name);

	// Create a new string entry
	StringEntry *entry = (StringEntry *)M_Malloc (sizeof(*entry) + newlen + namelen + 2);
	strcpy (entry->String, newString);
	strcpy (entry->Name = entry->String + newlen + 1, name);
	entry->PassNum = 0;

	// If this is a new string, insert it. Otherwise, replace the old one.
	if (oentry == NULL)
	{
		entry->Next = *pentry;
		*pentry = entry;
	}
	else
	{
		*pentry = entry;
		entry->Next = oentry->Next;
		M_Free (oentry);
	}
}